

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumpfile.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_11::WriteBatchItemPrinter::Put
          (WriteBatchItemPrinter *this,Slice *key,Slice *value)

{
  string r;
  void *local_60;
  string local_58;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"  put \'","");
  AppendEscapedStringTo(&local_58,key);
  std::__cxx11::string::append((char *)&local_58);
  AppendEscapedStringTo(&local_58,value);
  std::__cxx11::string::append((char *)&local_58);
  local_38 = local_58._M_dataplus._M_p._0_4_;
  uStack_34 = local_58._M_dataplus._M_p._4_4_;
  uStack_30 = (undefined4)local_58._M_string_length;
  uStack_2c = local_58._M_string_length._4_4_;
  (*this->dst_->_vptr_WritableFile[2])(&local_60);
  if (local_60 != (void *)0x0) {
    operator_delete__(local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Put(const Slice& key, const Slice& value) override {
    std::string r = "  put '";
    AppendEscapedStringTo(&r, key);
    r += "' '";
    AppendEscapedStringTo(&r, value);
    r += "'\n";
    dst_->Append(r);
  }